

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstToYaml.cpp
# Opt level: O3

void MyCompiler::Util::processAst<MyCompiler::Block>
               (Block *ast,int level,
               vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *items,string *name)

{
  pointer pcVar1;
  ConstDeclaration *ast_00;
  VarDeclaration *ast_01;
  pointer pPVar2;
  Statement *ast_02;
  int iVar3;
  char *__end;
  ProcedureDeclaration *subAst;
  pointer ast_03;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  int local_5c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  Block *local_38;
  
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  local_5c = level;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar1,pcVar1 + name->_M_string_length);
  std::__cxx11::string::append((char *)&local_58);
  std::
  vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>::
  emplace_back<int&,std::__cxx11::string>
            ((vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
              *)items,&local_5c,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  iVar3 = local_5c;
  ast_00 = (ast->pConstDeclaration).
           super___shared_ptr<MyCompiler::ConstDeclaration,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (ast_00 != (ConstDeclaration *)0x0) {
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"const-declaration","");
    name = &local_58;
    processAst<MyCompiler::ConstDeclaration>(ast_00,iVar3 + 1,items,name);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
  }
  iVar3 = local_5c;
  ast_01 = (ast->pVarDeclaration).
           super___shared_ptr<MyCompiler::VarDeclaration,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (ast_01 != (VarDeclaration *)0x0) {
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"var-declaration","");
    name = &local_58;
    processAst<MyCompiler::VarDeclaration>(ast_01,iVar3 + 1,items,name);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
  }
  local_38 = ast;
  if ((ast->vProcedureDeclaration).
      super__Vector_base<MyCompiler::ProcedureDeclaration,_std::allocator<MyCompiler::ProcedureDeclaration>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (ast->vProcedureDeclaration).
      super__Vector_base<MyCompiler::ProcedureDeclaration,_std::allocator<MyCompiler::ProcedureDeclaration>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_58._M_dataplus._M_p._0_4_ = local_5c + 1;
    std::
    vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
    ::emplace_back<int,char_const(&)[24]>
              ((vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                *)items,(int *)&local_58,(char (*) [24])"procedure-declarations:");
    ast_03 = (local_38->vProcedureDeclaration).
             super__Vector_base<MyCompiler::ProcedureDeclaration,_std::allocator<MyCompiler::ProcedureDeclaration>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pPVar2 = (local_38->vProcedureDeclaration).
             super__Vector_base<MyCompiler::ProcedureDeclaration,_std::allocator<MyCompiler::ProcedureDeclaration>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (ast_03 != pPVar2) {
      do {
        iVar3 = local_5c;
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"","");
        processAst<MyCompiler::ProcedureDeclaration>(ast_03,iVar3 + 2,items,name);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
        ast_03 = ast_03 + 1;
      } while (ast_03 != pPVar2);
    }
  }
  iVar3 = local_5c;
  ast_02 = (local_38->pStatement).
           super___shared_ptr<MyCompiler::Statement,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"");
  processAst<MyCompiler::Statement>(ast_02,iVar3 + 1,items,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void MyCompiler::Util::processAst<MyCompiler::Block>(
        Block &ast, int level,
        std::vector<std::pair<int, std::string>> &items, const std::string &name)
{
    items.emplace_back(level, name + ":");
    if (ast.pConstDeclaration != nullptr)
        processAst(*ast.pConstDeclaration, level + 1, items, "const-declaration");
    if (ast.pVarDeclaration != nullptr)
        processAst(*ast.pVarDeclaration, level + 1, items, "var-declaration");
    if (!ast.vProcedureDeclaration.empty())
    {
        items.emplace_back(level + 1, "procedure-declarations:");
        for (ProcedureDeclaration &subAst : ast.vProcedureDeclaration)
            processAst(subAst, level + 2, items, "");
    }
    processAst(*ast.pStatement, level + 1, items, "");
}